

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

void __thiscall
Clasp::DefaultUnfoundedCheck::setReasonStrategy(DefaultUnfoundedCheck *this,ReasonStrategy rs)

{
  ulong *puVar1;
  uint uVar2;
  size_t __n;
  
  this->strategy_ = rs;
  if (((rs == only_reason) && (this->solver_ != (Solver *)0x0)) && (this->reasons_ == (LitVec *)0x0)
     ) {
    uVar2 = (this->solver_->assign_).assign_.ebo_.size - 1;
    __n = (ulong)uVar2 * 0x10;
    puVar1 = (ulong *)operator_new__(__n + 8);
    *puVar1 = (ulong)uVar2;
    if (uVar2 != 0) {
      memset((LitVec *)(puVar1 + 1),0,__n);
    }
    this->reasons_ = (LitVec *)(puVar1 + 1);
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::setReasonStrategy(ReasonStrategy rs) {
	strategy_ = rs;
	if (strategy_ == only_reason && solver_ && !reasons_) {
		reasons_ = new LitVec[solver_->numVars()];
	}
}